

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::StencilTexturingTests::init(StencilTexturingTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  UploadTex2DCase *pUVar2;
  UploadTex2DArrayCase *pUVar3;
  UploadTexCubeCase *pUVar4;
  ClearTex2DCase *pCVar5;
  RenderTex2DCase *pRVar6;
  CompareModeCase *this_00;
  BaseLevelCase *this_01;
  TestCaseGroup *miscGroup;
  TestCaseGroup *readRenderGroup;
  TestCaseGroup *formatGroup;
  StencilTexturingTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"format",
             "Formats");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pUVar2 = (UploadTex2DCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DCase::UploadTex2DCase
            (pUVar2,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_2d",0x8cad);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar2);
  pUVar3 = (UploadTex2DArrayCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DArrayCase::UploadTex2DArrayCase
            (pUVar3,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_2d_array",0x8cad);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar3);
  pUVar4 = (UploadTexCubeCase *)operator_new(0x80);
  anon_unknown_1::UploadTexCubeCase::UploadTexCubeCase
            (pUVar4,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_cube",0x8cad);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar4);
  pUVar2 = (UploadTex2DCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DCase::UploadTex2DCase
            (pUVar2,(this->super_TestCaseGroup).m_context,"depth24_stencil8_2d",0x88f0);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar2);
  pUVar3 = (UploadTex2DArrayCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DArrayCase::UploadTex2DArrayCase
            (pUVar3,(this->super_TestCaseGroup).m_context,"depth24_stencil8_2d_array",0x88f0);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar3);
  pUVar4 = (UploadTexCubeCase *)operator_new(0x80);
  anon_unknown_1::UploadTexCubeCase::UploadTexCubeCase
            (pUVar4,(this->super_TestCaseGroup).m_context,"depth24_stencil8_cube",0x88f0);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar4);
  pUVar2 = (UploadTex2DCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DCase::UploadTex2DCase
            (pUVar2,(this->super_TestCaseGroup).m_context,"stencil_index8_2d",0x8d48);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar2);
  pUVar3 = (UploadTex2DArrayCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DArrayCase::UploadTex2DArrayCase
            (pUVar3,(this->super_TestCaseGroup).m_context,"stencil_index8_2d_array",0x8d48);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar3);
  pUVar4 = (UploadTexCubeCase *)operator_new(0x80);
  anon_unknown_1::UploadTexCubeCase::UploadTexCubeCase
            (pUVar4,(this->super_TestCaseGroup).m_context,"stencil_index8_cube",0x8d48);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pUVar4);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"render",
             "Read rendered stencil values");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pCVar5 = (ClearTex2DCase *)operator_new(0x80);
  anon_unknown_1::ClearTex2DCase::ClearTex2DCase
            (pCVar5,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_clear",0x8cad);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pCVar5);
  pRVar6 = (RenderTex2DCase *)operator_new(0x80);
  anon_unknown_1::RenderTex2DCase::RenderTex2DCase
            (pRVar6,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_draw",0x8cad);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar6);
  pCVar5 = (ClearTex2DCase *)operator_new(0x80);
  anon_unknown_1::ClearTex2DCase::ClearTex2DCase
            (pCVar5,(this->super_TestCaseGroup).m_context,"depth24_stencil8_clear",0x88f0);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pCVar5);
  pRVar6 = (RenderTex2DCase *)operator_new(0x80);
  anon_unknown_1::RenderTex2DCase::RenderTex2DCase
            (pRVar6,(this->super_TestCaseGroup).m_context,"depth24_stencil8_draw",0x88f0);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar6);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"misc",
             "Misc cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (CompareModeCase *)operator_new(0x80);
  anon_unknown_1::CompareModeCase::CompareModeCase
            (this_00,(this->super_TestCaseGroup).m_context,"compare_mode_effect",0x88f0);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
  this_01 = (BaseLevelCase *)operator_new(0x80);
  anon_unknown_1::BaseLevelCase::BaseLevelCase
            (this_01,(this->super_TestCaseGroup).m_context,"base_level",0x88f0);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void StencilTexturingTests::init (void)
{
	// .format
	{
		tcu::TestCaseGroup* const formatGroup = new tcu::TestCaseGroup(m_testCtx, "format", "Formats");
		addChild(formatGroup);

		formatGroup->addChild(new UploadTex2DCase		(m_context, "depth32f_stencil8_2d",			GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "depth32f_stencil8_2d_array",	GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "depth32f_stencil8_cube",		GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTex2DCase		(m_context, "depth24_stencil8_2d",			GL_DEPTH24_STENCIL8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "depth24_stencil8_2d_array",	GL_DEPTH24_STENCIL8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "depth24_stencil8_cube",		GL_DEPTH24_STENCIL8));

		// OES_texture_stencil8
		formatGroup->addChild(new UploadTex2DCase		(m_context, "stencil_index8_2d",			GL_STENCIL_INDEX8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "stencil_index8_2d_array",		GL_STENCIL_INDEX8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "stencil_index8_cube",			GL_STENCIL_INDEX8));
	}

	// .render
	{
		tcu::TestCaseGroup* const readRenderGroup = new tcu::TestCaseGroup(m_testCtx, "render", "Read rendered stencil values");
		addChild(readRenderGroup);

		readRenderGroup->addChild(new ClearTex2DCase	(m_context, "depth32f_stencil8_clear",	GL_DEPTH32F_STENCIL8));
		readRenderGroup->addChild(new RenderTex2DCase	(m_context, "depth32f_stencil8_draw",	GL_DEPTH32F_STENCIL8));
		readRenderGroup->addChild(new ClearTex2DCase	(m_context, "depth24_stencil8_clear",	GL_DEPTH24_STENCIL8));
		readRenderGroup->addChild(new RenderTex2DCase	(m_context, "depth24_stencil8_draw",	GL_DEPTH24_STENCIL8));
	}

	// .misc
	{
		tcu::TestCaseGroup* const miscGroup = new tcu::TestCaseGroup(m_testCtx, "misc", "Misc cases");
		addChild(miscGroup);

		miscGroup->addChild(new CompareModeCase	(m_context, "compare_mode_effect",	GL_DEPTH24_STENCIL8));
		miscGroup->addChild(new BaseLevelCase	(m_context, "base_level",			GL_DEPTH24_STENCIL8));
	}
}